

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_diag.cc
# Opt level: O0

void __thiscall
ipx::KKTSolverDiag::_Solve
          (KKTSolverDiag *this,Vector *a,Vector *b,double tol,Vector *x,Vector *y,Info *info)

{
  double dVar1;
  Int IVar2;
  time_t *__timer;
  double *pdVar3;
  char *pcVar4;
  valarray<double> *in_RCX;
  int __c;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  long in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar5;
  Int i_1;
  Int p;
  double aty;
  Int j_1;
  Int i;
  ConjugateResiduals cr;
  Int j;
  Vector rhs;
  SparseMatrix *AI;
  Int n;
  Int m;
  Int in_stack_000001f4;
  double *in_stack_000001f8;
  double in_stack_00000200;
  Vector *in_stack_00000208;
  LinearOperator *in_stack_00000210;
  LinearOperator *in_stack_00000218;
  ConjugateResiduals *in_stack_00000220;
  Vector *in_stack_00000230;
  valarray<double> *in_stack_fffffffffffffe58;
  undefined8 uVar6;
  SparseMatrix *in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  uint in_stack_fffffffffffffe8c;
  SparseMatrix *in_stack_fffffffffffffe90;
  uint local_ac;
  int local_a0;
  int local_9c;
  ConjugateResiduals local_98;
  undefined8 local_80;
  int local_64;
  _UnClos<std::__negate,_std::_ValArray,_double> local_60;
  SparseMatrix *local_48;
  Int local_40;
  Int local_3c;
  long local_38;
  undefined8 local_30;
  valarray<double> *local_28;
  valarray<double> *local_18;
  valarray<double> *local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_3c = Model::rows(*(Model **)(in_RDI + 0x10));
  local_40 = Model::cols(*(Model **)(in_RDI + 0x10));
  local_48 = Model::AI(*(Model **)(in_RDI + 0x10));
  local_60.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
       (_UnBase<std::__negate,_std::valarray<double>_>)
       std::valarray<double>::operator-(in_stack_fffffffffffffe58);
  std::valarray<double>::valarray<std::__detail::_UnClos<std::__negate,std::_ValArray,double>>
            ((valarray<double> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (_Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> *)
             in_stack_fffffffffffffe78);
  for (local_64 = 0; local_64 < local_40 + local_3c; local_64 = local_64 + 1) {
    std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x80),(long)local_64);
    std::valarray<double>::operator[](local_10,(long)local_64);
    ScatterColumn(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                  (double)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  in_stack_fffffffffffffe78);
  }
  local_80 = 0;
  std::valarray<double>::operator=
            ((valarray<double> *)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
  NormalMatrix::reset_time((NormalMatrix *)(in_RDI + 0x18));
  DiagonalPrecond::reset_time((DiagonalPrecond *)(in_RDI + 0x50));
  ConjugateResiduals::ConjugateResiduals(&local_98,*(Control **)(in_RDI + 8));
  __timer = (time_t *)(in_RDI + 0x18);
  std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x90),0);
  ConjugateResiduals::Solve
            (in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
             in_stack_00000200,in_stack_000001f8,in_stack_000001f4,in_stack_00000230);
  IVar2 = ConjugateResiduals::errflag(&local_98);
  *(Int *)(local_38 + 0xc) = IVar2;
  IVar2 = ConjugateResiduals::iter(&local_98);
  *(int *)(local_38 + 0xc4) = *(int *)(local_38 + 0xc4) + IVar2;
  ConjugateResiduals::time(&local_98,__timer);
  *(double *)(local_38 + 0x120) = *(double *)(local_38 + 0x120) + extraout_XMM0_Qa;
  NormalMatrix::time((NormalMatrix *)(in_RDI + 0x18),__timer);
  *(double *)(local_38 + 0x128) = *(double *)(local_38 + 0x128) + extraout_XMM0_Qa_00;
  DiagonalPrecond::time((DiagonalPrecond *)(in_RDI + 0x50),__timer);
  *(double *)(local_38 + 0x130) = *(double *)(local_38 + 0x130) + extraout_XMM0_Qa_01;
  IVar2 = ConjugateResiduals::iter(&local_98);
  *(Int *)(in_RDI + 0xa8) = IVar2 + *(int *)(in_RDI + 0xa8);
  uVar6 = local_30;
  for (local_9c = 0; local_9c < local_3c; local_9c = local_9c + 1) {
    pdVar3 = std::valarray<double>::operator[](local_18,(long)local_9c);
    dVar1 = *pdVar3;
    pdVar3 = std::valarray<double>::operator[](local_28,(long)(local_40 + local_9c));
    *pdVar3 = dVar1;
  }
  for (local_a0 = 0; local_a0 < local_40; local_a0 = local_a0 + 1) {
    dVar5 = DotColumn(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                      (Vector *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x80),(long)local_a0);
    dVar1 = *pdVar3;
    pdVar3 = std::valarray<double>::operator[](local_10,(long)local_a0);
    in_stack_fffffffffffffe90 = (SparseMatrix *)(dVar1 * (*pdVar3 - dVar5));
    pdVar3 = std::valarray<double>::operator[](local_28,(long)local_a0);
    *pdVar3 = (double)in_stack_fffffffffffffe90;
    in_stack_fffffffffffffe8c =
         SparseMatrix::begin(in_stack_fffffffffffffe60,(Int)((ulong)uVar6 >> 0x20));
    local_ac = in_stack_fffffffffffffe8c;
    while( true ) {
      in_stack_fffffffffffffe84 = local_ac;
      IVar2 = SparseMatrix::end(in_stack_fffffffffffffe60,(Int)((ulong)uVar6 >> 0x20));
      if (IVar2 <= (int)in_stack_fffffffffffffe84) break;
      pcVar4 = SparseMatrix::index(local_48,(char *)(ulong)local_ac,__c);
      in_stack_fffffffffffffe80 = (int)pcVar4;
      pdVar3 = std::valarray<double>::operator[](local_28,(long)local_a0);
      dVar1 = *pdVar3;
      dVar5 = SparseMatrix::value(in_stack_fffffffffffffe60,(Int)((ulong)uVar6 >> 0x20));
      in_stack_fffffffffffffe60 =
           (SparseMatrix *)
           std::valarray<double>::operator[](local_28,(long)(local_40 + (int)pcVar4));
      *(double *)in_stack_fffffffffffffe60 = -dVar1 * dVar5 + *(double *)in_stack_fffffffffffffe60;
      local_ac = local_ac + 1;
    }
  }
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void KKTSolverDiag::_Solve(const Vector& a, const Vector& b, double tol,
                            Vector& x, Vector& y, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(factorized_);

    // Compose right-hand side AI*W*a-b.
    Vector rhs = -b;
    for (Int j = 0; j < n+m; j++)
        ScatterColumn(AI, j, W_[j]*a[j], rhs);

    // Solve normal equations.
    y = 0.0;
    normal_matrix_.reset_time();
    precond_.reset_time();
    ConjugateResiduals cr(control_);
    cr.Solve(normal_matrix_, precond_, rhs, tol, &resscale_[0], maxiter_, y);
    info->errflag = cr.errflag();
    info->kktiter1 += cr.iter();
    info->time_cr1 += cr.time();
    info->time_cr1_AAt += normal_matrix_.time();
    info->time_cr1_pre += precond_.time();
    iter_ += cr.iter();

    // Recover solution to KKT system.
    for (Int i = 0; i < m; i++)
        x[n+i] = b[i];
    for (Int j = 0; j < n; j++) {
        double aty = DotColumn(AI, j, y);
        x[j] = W_[j] * (a[j]-aty);
        for (Int p = AI.begin(j); p < AI.end(j); p++) {
            Int i = AI.index(p);
            x[n+i] -= x[j] * AI.value(p);
        }
    }
}